

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManUpdateStats(Nf_Man_t *p)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Jf_Par_t *pJVar5;
  Gia_Man_t *pGVar6;
  Gia_Obj_t *pGVar7;
  undefined8 uVar8;
  Nf_Obj_t *pNVar9;
  int *piVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  Nf_Mat_t *pNVar15;
  long lVar16;
  word wVar17;
  word wVar18;
  long lVar19;
  uint uVar20;
  Nf_Mat_t *pNVar21;
  bool bVar22;
  uint uVar23;
  ulong uVar24;
  float fVar25;
  
  pJVar5 = p->pPars;
  pJVar5->MapAreaF = 0.0;
  p->nInvs = 0;
  pJVar5->Area = 0;
  pJVar5->Edge = 0;
  pGVar6 = p->pGia;
  iVar2 = pGVar6->nObjs;
  if ((long)iVar2 < 2) {
    iVar12 = 0;
    fVar25 = 0.0;
    wVar17 = 0;
    wVar18 = 0;
  }
  else {
    pGVar7 = pGVar6->pObjs;
    fVar25 = 0.0;
    iVar12 = 0;
    wVar17 = 0;
    wVar18 = 0;
    lVar19 = (long)iVar2;
    do {
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      lVar16 = lVar19 + -1;
      uVar8 = *(undefined8 *)(pGVar7 + lVar16);
      uVar13 = (uint)uVar8;
      if ((~uVar13 & 0x1fffffff) != 0 && -1 < (int)uVar13) {
        if (((uVar13 & 0x1fffffff) == 0x1fffffff) ||
           ((uVar13 & 0x1fffffff) != ((uint)((ulong)uVar8 >> 0x20) & 0x1fffffff))) {
          iVar3 = (p->vMapRefs).nSize;
          uVar24 = 0;
          bVar11 = true;
          do {
            bVar22 = bVar11;
            uVar14 = uVar24 | (uint)((int)lVar16 * 2);
            if (iVar3 <= (int)uVar14) goto LAB_0078b8b1;
            if ((p->vMapRefs).pArray[uVar14] != 0) {
              pNVar9 = p->pNfObjs;
              uVar13 = *(uint *)pNVar9[lVar16].M[uVar24];
              uVar4 = *(uint *)(pNVar9[lVar16].M[uVar24] + 1);
              if (-1 < (int)(uVar4 ^ uVar13)) {
                __assert_fail("pD->fBest != pA->fBest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x583,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
              }
              if ((int)uVar13 < 0) {
                pNVar21 = pNVar9[lVar16].M[uVar24];
              }
              else {
                pNVar21 = (Nf_Mat_t *)0x0;
              }
              pNVar15 = pNVar9[lVar16].M[uVar24] + 1;
              if (-1 < (int)uVar4) {
                pNVar15 = pNVar21;
              }
              uVar13 = *(uint *)&pNVar15->field_0x0;
              if ((uVar13 >> 0x1e & 1) == 0) {
                if ((p->vCutSets).nSize < lVar19) goto LAB_0078b8b1;
                uVar4 = (p->vCutSets).pArray[lVar16];
                uVar20 = (int)uVar4 >> 0x10;
                if (((int)uVar20 < 0) || ((p->vPages).nSize <= (int)uVar20)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                uVar23 = uVar13 >> 0x14 & 0x3ff;
                if (uVar23 == 0) {
                  __assert_fail("h > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                                ,0x94,"int *Nf_CutFromHandle(int *, int)");
                }
                uVar24 = (ulong)((uVar13 & 0xfffff) * 0x50);
                uVar13 = *(uint *)((long)(p->vPages).pArray[uVar20] +
                                  (ulong)uVar23 * 4 + (ulong)(uVar4 & 0xffff) * 4) & 0x1f;
                if (uVar13 != *(uint *)((long)p->pCells->iDelays + (uVar24 - 0x1c)) >> 0x1c) {
                  __assert_fail("Nf_CutSize(pCut) == (int)pCell->nFanins",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                                ,0x865,"void Nf_ManUpdateStats(Nf_Man_t *)");
                }
                fVar25 = fVar25 + *(float *)((long)p->pCells->iDelays + (uVar24 - 0x18));
                pJVar5->MapAreaF = fVar25;
                wVar18 = wVar18 + uVar13;
                pJVar5->Edge = wVar18;
                wVar17 = wVar17 + 1;
                pJVar5->Area = wVar17;
              }
              else {
                fVar25 = fVar25 + p->InvAreaF;
                pJVar5->MapAreaF = fVar25;
                wVar18 = wVar18 + 1;
                pJVar5->Edge = wVar18;
                wVar17 = wVar17 + 1;
                pJVar5->Area = wVar17;
                iVar12 = iVar12 + 1;
                p->nInvs = iVar12;
              }
            }
            uVar24 = 1;
            bVar11 = false;
          } while (bVar22);
        }
        else {
          lVar1 = lVar16 * 2 + 1;
          if ((p->vMapRefs).nSize <= lVar1) goto LAB_0078b8b1;
          if ((p->vMapRefs).pArray[lVar1] != 0) {
            fVar25 = fVar25 + p->InvAreaF;
            pJVar5->MapAreaF = fVar25;
            wVar18 = wVar18 + 1;
            pJVar5->Edge = wVar18;
            wVar17 = wVar17 + 1;
            pJVar5->Area = wVar17;
            iVar12 = iVar12 + 1;
            p->nInvs = iVar12;
          }
        }
      }
      bVar11 = 2 < lVar19;
      lVar19 = lVar16;
    } while (bVar11);
  }
  lVar19 = (long)pGVar6->vCis->nSize;
  if (0 < lVar19) {
    piVar10 = pGVar6->vCis->pArray;
    lVar16 = 0;
    do {
      uVar13 = piVar10[lVar16];
      if (((int)uVar13 < 0) || (iVar2 <= (int)uVar13)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((ulong)uVar13 == 0) {
        return;
      }
      lVar1 = (ulong)uVar13 * 2 + 1;
      if ((p->vMapRefs).nSize <= (int)lVar1) {
LAB_0078b8b1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((p->vMapRefs).pArray[lVar1] != 0) {
        fVar25 = fVar25 + p->InvAreaF;
        pJVar5->MapAreaF = fVar25;
        wVar18 = wVar18 + 1;
        pJVar5->Edge = wVar18;
        wVar17 = wVar17 + 1;
        pJVar5->Area = wVar17;
        iVar12 = iVar12 + 1;
        p->nInvs = iVar12;
      }
      lVar16 = lVar16 + 1;
    } while (lVar19 != lVar16);
  }
  return;
}

Assistant:

void Nf_ManUpdateStats( Nf_Man_t * p )
{
    Nf_Mat_t * pM;
    Gia_Obj_t * pObj;
    Mio_Cell2_t * pCell;
    int i, c, Id, * pCut;
    p->pPars->MapAreaF = 0; p->nInvs = 0;
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
            {
                p->pPars->MapAreaF += p->InvAreaF;
                p->pPars->Edge++;
                p->pPars->Area++;
                p->nInvs++;
            }
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            if ( pM->fCompl )
            {
                p->pPars->MapAreaF += p->InvAreaF;
                p->pPars->Edge++;
                p->pPars->Area++;
                p->nInvs++;
                continue;
            }
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
            pCell = Nf_ManCell( p, pM->Gate );
            assert( Nf_CutSize(pCut) == (int)pCell->nFanins );
            p->pPars->MapAreaF += pCell->AreaF;
            p->pPars->Edge += Nf_CutSize(pCut);
            p->pPars->Area++;
            //printf( "%5d (%d) : Gate = %7s \n", i, c, pCell->pName );
        }
    }
    Gia_ManForEachCiId( p->pGia, Id, i )
        if ( Nf_ObjMapRefNum(p, Id, 1) )
        {
            p->pPars->MapAreaF += p->InvAreaF;
            p->pPars->Edge++;
            p->pPars->Area++;
            p->nInvs++;
        }
}